

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprFold(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal)

{
  int iVar1;
  int local_28;
  int bRemoveDiacritics;
  int iCode;
  sqlite3_value **apVal_local;
  int nArg_local;
  sqlite3_context *pCtx_local;
  
  if ((nArg == 1) || (nArg == 2)) {
    local_28 = 0;
    iVar1 = sqlite3_value_int(*apVal);
    if (nArg == 2) {
      local_28 = sqlite3_value_int(apVal[1]);
    }
    iVar1 = sqlite3Fts5UnicodeFold(iVar1,local_28);
    sqlite3_result_int(pCtx,iVar1);
  }
  else {
    sqlite3_result_error(pCtx,"wrong number of arguments to function fts5_fold",-1);
  }
  return;
}

Assistant:

static void fts5ExprFold(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apVal           /* Function arguments */
){
  if( nArg!=1 && nArg!=2 ){
    sqlite3_result_error(pCtx, 
        "wrong number of arguments to function fts5_fold", -1
    );
  }else{
    int iCode;
    int bRemoveDiacritics = 0;
    iCode = sqlite3_value_int(apVal[0]);
    if( nArg==2 ) bRemoveDiacritics = sqlite3_value_int(apVal[1]);
    sqlite3_result_int(pCtx, sqlite3Fts5UnicodeFold(iCode, bRemoveDiacritics));
  }
}